

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

int __thiscall
mp::internal::BinaryReader<mp::internal::IdentityConverter>::ReadUInt
          (BinaryReader<mp::internal::IdentityConverter> *this)

{
  BinaryReader<mp::internal::IdentityConverter> *in_RDI;
  BinaryReaderBase *in_stack_00000008;
  CStringRef in_stack_00000010;
  int value;
  BasicCStringRef<char> local_18;
  int local_c;
  
  local_c = ReadInt<int>(in_RDI);
  if (local_c < 0) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_18,"expected unsigned integer");
    BinaryReaderBase::ReportError<>(in_stack_00000008,in_stack_00000010);
  }
  return local_c;
}

Assistant:

int ReadUInt() {
    int value = ReadInt<int>();
    if (value < 0)
      ReportError("expected unsigned integer");
    return value;
  }